

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  FeatureDescription *pFVar5;
  Arena *pAVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetwork *this;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar9;
  QuantizationParams *pQVar10;
  LinearQuantizationParams *pLVar11;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar12;
  reference from;
  char *local_2b0;
  char *local_2a0;
  char *local_278;
  FeatureDescription *trainingInput;
  FeatureDescription feature;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  LinearQuantizationParams *linear_quant_params_1;
  QuantizationParams *quant_params_1;
  WeightParams *bias;
  LinearQuantizationParams *linear_quant_params;
  QuantizationParams *quant_params;
  WeightParams *weights;
  InnerProductLayerParams *innerProductParams;
  string local_198;
  undefined1 local_178 [8];
  string output;
  undefined1 local_138 [8];
  string input;
  string local_108;
  undefined1 local_e8 [8];
  string layerName;
  NeuralNetworkLayer *layer;
  int i_2;
  NeuralNetwork *neuralNet;
  int i_1;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  int i;
  ArrayFeatureType *inTensorShape;
  FeatureDescription *inTensor;
  bool isBiasQuantized_local;
  bool areWeightsQuantized_local;
  int numberOfLayers_local;
  TensorAttributes *outTensorAttr_local;
  TensorAttributes *inTensorAttr_local;
  bool isUpdatable_local;
  Model *m_local;
  
  pMVar4 = CoreML::Specification::Model::mutable_description(m);
  pFVar5 = CoreML::Specification::ModelDescription::add_input(pMVar4);
  pcVar1 = inTensorAttr->name;
  pAVar6 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,pcVar1,pAVar6);
  pFVar7 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pAVar8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar7);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar8,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (outTensor._4_4_ = 0; outTensor._4_4_ < inTensorAttr->dimension;
      outTensor._4_4_ = outTensor._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar8,1);
  }
  pMVar4 = CoreML::Specification::Model::mutable_description(m);
  pFVar5 = CoreML::Specification::ModelDescription::add_output(pMVar4);
  pcVar1 = outTensorAttr->name;
  pAVar6 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,pcVar1,pAVar6);
  pFVar7 = CoreML::Specification::FeatureDescription::mutable_type(pFVar5);
  pAVar8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar7);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar8,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (neuralNet._4_4_ = 0; neuralNet._4_4_ < outTensorAttr->dimension;
      neuralNet._4_4_ = neuralNet._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar8,1);
  }
  CoreML::Specification::Model::set_specificationversion(m,4);
  this = CoreML::Specification::Model::mutable_neuralnetwork(m);
  for (layer._4_4_ = 0; layer._4_4_ < numberOfLayers; layer._4_4_ = layer._4_4_ + 1) {
    layerName.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this);
    std::__cxx11::to_string(&local_108,layer._4_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "inner_layer",&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::to_string((string *)((long)&output.field_2 + 8),layer._4_4_ + -1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "output",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&output.field_2 + 8));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::to_string(&local_198,layer._4_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   "output",&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    uVar2 = layerName.field_2._8_8_;
    if (numberOfLayers == 1) {
      local_278 = "inner_layer";
    }
    else {
      local_278 = (char *)std::__cxx11::string::c_str();
    }
    pAVar6 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)uVar2);
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              ((ArenaStringPtr *)(uVar2 + 0x70),local_278,pAVar6);
    uVar2 = layerName.field_2._8_8_;
    if (layer._4_4_ == 0) {
      local_2a0 = inTensorAttr->name;
    }
    else {
      local_2a0 = (char *)std::__cxx11::string::c_str();
    }
    CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)uVar2,local_2a0);
    uVar2 = layerName.field_2._8_8_;
    if (layer._4_4_ == numberOfLayers + -1) {
      local_2b0 = outTensorAttr->name;
    }
    else {
      local_2b0 = (char *)std::__cxx11::string::c_str();
    }
    CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)uVar2,local_2b0);
    this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                        ((NeuralNetworkLayer *)layerName.field_2._8_8_);
    CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_00,1);
    CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_00,1);
    pWVar9 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
    if (areWeightsQuantized) {
      pQVar10 = CoreML::Specification::WeightParams::mutable_quantization(pWVar9);
      CoreML::Specification::QuantizationParams::set_numberofbits(pQVar10,1);
      pLVar11 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar10);
      CoreML::Specification::LinearQuantizationParams::add_scale(pLVar11,1.0);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar11,0.0);
      pAVar6 = google::protobuf::MessageLite::GetArenaForAllocation(&pWVar9->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::
      SetBytes<google::protobuf::internal::ArenaStringPtr::EmptyDefault,char_const(&)[4]>
                (&pWVar9->int8rawvalue_,"x01",pAVar6);
    }
    else {
      CoreML::Specification::WeightParams::add_floatvalue(pWVar9,1.0);
    }
    CoreML::Specification::InnerProductLayerParams::set_hasbias(this_00,true);
    pWVar9 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
    if (isBiasQuantized) {
      pQVar10 = CoreML::Specification::WeightParams::mutable_quantization(pWVar9);
      CoreML::Specification::QuantizationParams::set_numberofbits(pQVar10,1);
      pLVar11 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar10);
      CoreML::Specification::LinearQuantizationParams::add_scale(pLVar11,1.0);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar11,0.0);
      pAVar6 = google::protobuf::MessageLite::GetArenaForAllocation(&pWVar9->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::
      SetBytes<google::protobuf::internal::ArenaStringPtr::EmptyDefault,char_const(&)[4]>
                (&pWVar9->int8rawvalue_,"x01",pAVar6);
    }
    else {
      CoreML::Specification::WeightParams::add_floatvalue(pWVar9,1.0);
    }
    if (isUpdatable) {
      CoreML::Specification::NeuralNetworkLayer::set_isupdatable
                ((NeuralNetworkLayer *)layerName.field_2._8_8_,true);
      pWVar9 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
      CoreML::Specification::WeightParams::set_isupdatable(pWVar9,true);
      pWVar9 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
      CoreML::Specification::WeightParams::set_isupdatable(pWVar9,true);
    }
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_e8);
  }
  if (isUpdatable) {
    CoreML::Specification::Model::set_isupdatable(m,true);
    pMVar4 = CoreML::Specification::Model::description(m);
    pRVar12 = CoreML::Specification::ModelDescription::input(pMVar4);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar12);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar12)
    ;
    while (bVar3 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2,(iterator *)&feature._cached_size_), bVar3) {
      from = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end2);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInput,from);
      pMVar4 = CoreML::Specification::Model::mutable_description(m);
      pRVar12 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar4);
      pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (pRVar12);
      CoreML::Specification::FeatureDescription::CopyFrom
                (pFVar5,(FeatureDescription *)&trainingInput);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInput);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2);
    }
  }
  return this;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}